

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDetect.c
# Opt level: O2

void Abc_NtkFinLocalSetup(Vec_Int_t *vPairs,Vec_Int_t *vList,Vec_Wec_t *vMap2,Vec_Int_t *vResArray)

{
  int Entry1;
  int i;
  Vec_Int_t *p;
  int i_00;
  
  vResArray->nSize = 0;
  for (i_00 = 0; i_00 < vList->nSize; i_00 = i_00 + 1) {
    Entry1 = Vec_IntEntry(vList,i_00);
    i = Vec_IntEntry(vPairs,Entry1 * 2);
    p = Vec_WecEntry(vMap2,i);
    Vec_IntPushTwo(p,Entry1,i_00);
    Vec_IntPushTwo(vResArray,Entry1,i_00);
  }
  return;
}

Assistant:

void Abc_NtkFinLocalSetup( Vec_Int_t * vPairs, Vec_Int_t * vList, Vec_Wec_t * vMap2, Vec_Int_t * vResArray )
{
    int i, iFin;
    Vec_IntClear( vResArray );
    Vec_IntForEachEntry( vList, iFin, i )
    {
        int iObj = Vec_IntEntry( vPairs, 2*iFin );
        Vec_Int_t * vArray = Vec_WecEntry( vMap2, iObj );
        Vec_IntPushTwo( vArray, iFin, i );
        Vec_IntPushTwo( vResArray, iFin, i );
    }
}